

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O3

void __thiscall serialization::xml_oarchive::~xml_oarchive(xml_oarchive *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->str_)._M_dataplus._M_p;
  paVar1 = &(this->str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  rapidxml::memory_pool<char>::clear(&(this->document_).super_memory_pool<char>);
  return;
}

Assistant:

xml_oarchive()
    {
    }